

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void free_symbols(MOJOSHADER_free f,void *d,MOJOSHADER_symbol *syms,int symcount)

{
  int local_28;
  int i;
  int symcount_local;
  MOJOSHADER_symbol *syms_local;
  void *d_local;
  MOJOSHADER_free f_local;
  
  for (local_28 = 0; local_28 < symcount; local_28 = local_28 + 1) {
    (*f)(syms[local_28].name,d);
    free_sym_typeinfo(f,d,&syms[local_28].info);
  }
  (*f)(syms,d);
  return;
}

Assistant:

static void free_symbols(MOJOSHADER_free f, void *d, MOJOSHADER_symbol *syms,
                         const int symcount)
{
    int i;
    for (i = 0; i < symcount; i++)
    {
        f((void *) syms[i].name, d);
        free_sym_typeinfo(f, d, &syms[i].info);
    } // for
    f((void *) syms, d);
}